

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_delay(char *name,wchar_t unused)

{
  byte bVar1;
  _Bool _Var2;
  uint in_EAX;
  uint uVar3;
  char *str;
  ulong uVar4;
  uint uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  char tmp [4];
  
  bVar1 = (player->opts).delay_factor;
  strnfmt(&stack0xffffffffffffffdc,4,"%i",(ulong)bVar1,in_R8,in_R9,(ulong)in_EAX);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Base Delay Factor",L'\x14',L'\0');
  prt("New base delay factor (0-255): ",L'\x15',L'\0');
  str = format("Current base delay factor: %d msec",(ulong)bVar1);
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  _Var2 = askfor_aux(&stack0xffffffffffffffdc,4,askfor_aux_numbers);
  if (_Var2) {
    uVar4 = strtoul(&stack0xffffffffffffffdc,(char **)0x0,0);
    uVar3 = (uint)uVar4 & 0xffff;
    uVar5 = 0xff;
    if (uVar3 < 0xff) {
      uVar5 = uVar3;
    }
    (player->opts).delay_factor = (uint8_t)uVar5;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_delay(const char *name, int unused)
{
	char tmp[4] = "";
	int msec = player->opts.delay_factor;

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.delay_factor);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Base Delay Factor", 20, 0);
	prt("New base delay factor (0-255): ", 21, 0);
	prt(format("Current base delay factor: %d msec", msec), 22, 0);
	prt("", 23, 0);

	/* Ask for a numeric value */
	if (askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers)) {
		uint16_t val = (uint16_t) strtoul(tmp, NULL, 0);
		player->opts.delay_factor = MIN(val, 255);
	}

	screen_load();
}